

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receptor.cpp
# Opt level: O1

void __thiscall indk::Neuron::Receptor::Receptor(Receptor *this)

{
  Position *pPVar1;
  
  (this->ReferencePos).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ReferencePos).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CPf).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CPf).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CP).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CPf).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CP).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CP).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ReferencePos).super__Vector_base<indk::Position_*,_std::allocator<indk::Position_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = (Position *)operator_new(0x10);
  Position::Position(pPVar1);
  this->DefaultPos = pPVar1;
  pPVar1 = (Position *)operator_new(0x10);
  Position::Position(pPVar1);
  this->PhantomPos = pPVar1;
  this->k3 = 0.0;
  this->Rs = 0.01;
  this->Locked = false;
  this->L = 0.0;
  this->Lf = 0.0;
  this->Fi = 0.0;
  this->dFi = 0.0;
  doCreateNewScope(this);
  return;
}

Assistant:

indk::Neuron::Receptor::Receptor() {
	DefaultPos = new indk::Position();
	PhantomPos = new indk::Position();
    k3 = 0;
    Rs = 0.01;
    Locked = false;
    L = 0;
    Lf = 0;
    Fi = 0;
    dFi = 0;
    doCreateNewScope();
}